

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::pipeline::anon_unknown_0::AlphaToOneInstance::verifyImage
          (TestStatus *__return_storage_ptr__,AlphaToOneInstance *this,
          ConstPixelBufferAccess *alphaOneImage,ConstPixelBufferAccess *noAlphaOneImage)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  allocator<char> local_241;
  string local_240;
  string local_220;
  undefined1 local_1fc [16];
  undefined1 local_1ec [36];
  ostringstream message;
  undefined1 local_54 [16];
  undefined1 local_44 [16];
  Vector<bool,_4> local_34;
  int local_30;
  int local_2c;
  int x;
  int y;
  ConstPixelBufferAccess *noAlphaOneImage_local;
  ConstPixelBufferAccess *alphaOneImage_local;
  AlphaToOneInstance *this_local;
  
  local_2c = 0;
  _x = noAlphaOneImage;
  noAlphaOneImage_local = alphaOneImage;
  alphaOneImage_local = (ConstPixelBufferAccess *)this;
  this_local = (AlphaToOneInstance *)__return_storage_ptr__;
  do {
    iVar1 = local_2c;
    iVar3 = tcu::Vector<int,_2>::y(&this->m_renderSize);
    if (iVar3 <= iVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_240,
                 "Image rendered with alpha-to-one contains pixels of image rendered with no alpha-to-one"
                 ,&local_241);
      tcu::TestStatus::pass(__return_storage_ptr__,&local_240);
      std::__cxx11::string::~string((string *)&local_240);
      std::allocator<char>::~allocator(&local_241);
      return __return_storage_ptr__;
    }
    for (local_30 = 0; iVar1 = local_30, iVar3 = tcu::Vector<int,_2>::x(&this->m_renderSize),
        iVar1 < iVar3; local_30 = local_30 + 1) {
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)local_44,(int)noAlphaOneImage_local,local_30,local_2c);
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)local_54,(int)_x,local_30,local_2c);
      tcu::greaterThanEqual<float,4>
                ((tcu *)&local_34,(Vector<float,_4> *)local_44,(Vector<float,_4> *)local_54);
      bVar2 = tcu::boolAll<4>(&local_34);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1ec + 0x1c));
        poVar4 = std::operator<<((ostream *)(local_1ec + 0x1c),"Unsatisfied condition: ");
        tcu::ConstPixelBufferAccess::getPixel
                  ((ConstPixelBufferAccess *)local_1ec,(int)noAlphaOneImage_local,local_30,local_2c)
        ;
        poVar4 = tcu::operator<<(poVar4,(Vector<float,_4> *)local_1ec);
        poVar4 = std::operator<<(poVar4," >= ");
        tcu::ConstPixelBufferAccess::getPixel
                  ((ConstPixelBufferAccess *)local_1fc,(int)_x,local_30,local_2c);
        tcu::operator<<(poVar4,(Vector<float,_4> *)local_1fc);
        std::__cxx11::ostringstream::str();
        tcu::TestStatus::fail(__return_storage_ptr__,&local_220);
        std::__cxx11::string::~string((string *)&local_220);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1ec + 0x1c));
        return __return_storage_ptr__;
      }
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

tcu::TestStatus AlphaToOneInstance::verifyImage (const tcu::ConstPixelBufferAccess&	alphaOneImage,
												 const tcu::ConstPixelBufferAccess&	noAlphaOneImage)
{
	for (int y = 0; y < m_renderSize.y(); y++)
	{
		for (int x = 0; x < m_renderSize.x(); x++)
		{
			if (!tcu::boolAll(tcu::greaterThanEqual(alphaOneImage.getPixel(x, y), noAlphaOneImage.getPixel(x, y))))
			{
				std::ostringstream message;
				message << "Unsatisfied condition: " << alphaOneImage.getPixel(x, y) << " >= " << noAlphaOneImage.getPixel(x, y);
				return tcu::TestStatus::fail(message.str());
			}
		}
	}

	return tcu::TestStatus::pass("Image rendered with alpha-to-one contains pixels of image rendered with no alpha-to-one");
}